

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O0

void Psr_ManSaveCover(Psr_Man_t *p)

{
  Psr_Ntk_t *pPVar1;
  char cVar2;
  int iVar3;
  Bac_ObjType_t m;
  char *pSop;
  int iToken;
  Psr_Man_t *p_local;
  
  iVar3 = Vec_StrSize(&p->vCover);
  if (iVar3 == 0) {
    p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xfb | 4;
  }
  else {
    iVar3 = Vec_StrSize(&p->vCover);
    if (iVar3 == 2) {
      cVar2 = Vec_StrEntryLast(&p->vCover);
      if (cVar2 == '0') {
        p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xfb | 4;
      }
      else {
        cVar2 = Vec_StrEntryLast(&p->vCover);
        if (cVar2 != '1') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacReadBlif.c"
                        ,0xe9,"void Psr_ManSaveCover(Psr_Man_t *)");
        }
        p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xf7 | 8;
      }
    }
  }
  iVar3 = Vec_StrSize(&p->vCover);
  if (iVar3 < 1) {
    __assert_fail("Vec_StrSize(&p->vCover) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacReadBlif.c"
                  ,0xeb,"void Psr_ManSaveCover(Psr_Man_t *)");
  }
  Vec_StrPush(&p->vCover,'\0');
  pSop = Vec_StrArray(&p->vCover);
  m = Ptr_SopToType(pSop);
  Vec_StrClear(&p->vCover);
  pPVar1 = p->pNtk;
  iVar3 = Psr_NtkBoxNum(p->pNtk);
  iVar3 = Psr_BoxNtk(pPVar1,iVar3 + -1);
  if (iVar3 != 1) {
    __assert_fail("Psr_BoxNtk(p->pNtk, Psr_NtkBoxNum(p->pNtk)-1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacReadBlif.c"
                  ,0xf1,"void Psr_ManSaveCover(Psr_Man_t *)");
  }
  pPVar1 = p->pNtk;
  iVar3 = Psr_NtkBoxNum(p->pNtk);
  Psr_BoxSetNtk(pPVar1,iVar3 + -1,m);
  return;
}

Assistant:

static inline void Psr_ManSaveCover( Psr_Man_t * p )
{
    int iToken;
    if ( Vec_StrSize(&p->vCover) == 0 )
        p->pNtk->fHasC0s = 1;
    else if ( Vec_StrSize(&p->vCover) == 2 )
    {
        if ( Vec_StrEntryLast(&p->vCover) == '0' )
            p->pNtk->fHasC0s = 1;
        else if ( Vec_StrEntryLast(&p->vCover) == '1' )
            p->pNtk->fHasC1s = 1;
        else assert( 0 );
    }
    assert( Vec_StrSize(&p->vCover) > 0 );
    Vec_StrPush( &p->vCover, '\0' );
    //iToken = Abc_NamStrFindOrAdd( p->pStrs, Vec_StrArray(&p->vCover), NULL );
    iToken = Ptr_SopToType( Vec_StrArray(&p->vCover) );
    Vec_StrClear( &p->vCover );
    // set the cover to the module of this box
    assert( Psr_BoxNtk(p->pNtk, Psr_NtkBoxNum(p->pNtk)-1) == 1 ); // default const 0
    Psr_BoxSetNtk( p->pNtk, Psr_NtkBoxNum(p->pNtk)-1, iToken );
}